

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

OpenRangeExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OpenRangeExpressionSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1,Token *args_2,
          ExpressionSyntax *args_3,Token *args_4)

{
  Token openBracket;
  Token colon;
  Token closeBracket;
  OpenRangeExpressionSyntax *this_00;
  
  this_00 = (OpenRangeExpressionSyntax *)allocate(this,0x50,8);
  openBracket.kind = args->kind;
  openBracket._2_1_ = args->field_0x2;
  openBracket.numFlags.raw = (args->numFlags).raw;
  openBracket.rawLen = args->rawLen;
  openBracket.info = args->info;
  colon.kind = args_2->kind;
  colon._2_1_ = args_2->field_0x2;
  colon.numFlags.raw = (args_2->numFlags).raw;
  colon.rawLen = args_2->rawLen;
  colon.info = args_2->info;
  closeBracket.kind = args_4->kind;
  closeBracket._2_1_ = args_4->field_0x2;
  closeBracket.numFlags.raw = (args_4->numFlags).raw;
  closeBracket.rawLen = args_4->rawLen;
  closeBracket.info = args_4->info;
  slang::syntax::OpenRangeExpressionSyntax::OpenRangeExpressionSyntax
            (this_00,openBracket,args_1,colon,args_3,closeBracket);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }